

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void SimpleVFilter16_C(uint8_t *p,int stride,int thresh)

{
  int iVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    iVar1 = NeedsFilter_C(p + lVar2,stride,thresh * 2 + 1);
    if (iVar1 != 0) {
      DoFilter2_C(p + lVar2,stride);
    }
  }
  return;
}

Assistant:

static void SimpleVFilter16_C(uint8_t* p, int stride, int thresh) {
  int i;
  const int thresh2 = 2 * thresh + 1;
  for (i = 0; i < 16; ++i) {
    if (NeedsFilter_C(p + i, stride, thresh2)) {
      DoFilter2_C(p + i, stride);
    }
  }
}